

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O1

void __thiscall
CPP::WriteInitialization::addStringInitializer
          (WriteInitialization *this,Item *item,DomPropertyMap *properties,QString *name,int column,
          QString *directive)

{
  DomString *element;
  bool translatable;
  Node<QString,_DomProperty_*> *pNVar1;
  DomProperty **ppDVar2;
  DomProperty *pDVar3;
  qsizetype qVar4;
  QArrayData *pQVar5;
  long in_FS_OFFSET;
  QString local_78;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (properties->d != (Data<QHashPrivate::Node<QString,_DomProperty_*>_> *)0x0) {
    pNVar1 = QHashPrivate::Data<QHashPrivate::Node<QString,_DomProperty_*>_>::findNode<QString>
                       (properties->d,name);
    if (pNVar1 != (Node<QString,_DomProperty_*> *)0x0) {
      ppDVar2 = &pNVar1->value;
      goto LAB_001315fe;
    }
  }
  ppDVar2 = (DomProperty **)0x0;
LAB_001315fe:
  if (ppDVar2 == (DomProperty **)0x0) {
    pDVar3 = (DomProperty *)0x0;
  }
  else {
    pDVar3 = *ppDVar2;
  }
  if (pDVar3 != (DomProperty *)0x0) {
    element = pDVar3->m_string;
    if (element == (DomString *)0x0) {
      pQVar5 = (QArrayData *)0x0;
      qVar4 = 0;
    }
    else {
      pQVar5 = &((element->m_text).d.d)->super_QArrayData;
      qVar4 = (element->m_text).d.size;
      if (pQVar5 != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&pQVar5->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)&pQVar5->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    if (qVar4 != 0) {
      translatable = needsTranslation<DomString>(element);
      local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      local_78.d.d = (Data *)0x0;
      local_78.d.ptr = (char16_t *)0x0;
      local_78.d.size = 0;
      autoTrCall(&local_58,this,element,&local_78);
      addInitializer(item,name,column,&local_58,directive,translatable);
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WriteInitialization::addStringInitializer(Item *item,
        const DomPropertyMap &properties, const QString &name, int column, const QString &directive) const
{
    if (const DomProperty *p = properties.value(name)) {
        DomString *str = p->elementString();
        QString text = toString(str);
        if (!text.isEmpty()) {
            bool translatable = needsTranslation(str);
            QString value = autoTrCall(str);
            addInitializer(item, name, column, value, directive, translatable);
        }
    }
}